

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O2

Object * __thiscall
chatra::Reference::
allocateWithoutLock<chatra::Object,chatra::TypeId,std::vector<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>,std::allocator<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>>>,std::vector<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>,std::allocator<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>>>,std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>const&>
          (Reference *this,TypeId *args,
          vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
          *args_1,vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
                  *args_2,
          unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
          *args_3)

{
  Object *this_00;
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b0;
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  local_78;
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  local_60;
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  Storage *local_40;
  TypeId local_34;
  
  local_48 = &args_3->_M_h;
  this_00 = (Object *)operator_new(0xa8);
  local_40 = this->node->group->storage;
  local_34 = *args;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_1->
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_1->
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_2->
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_60.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_2->
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_60.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_2->
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_2->
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_2->
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_2->
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_b0,local_48);
  Object::Object(this_00,local_40,local_34,&local_78,&local_60,
                 (unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
                  *)&local_b0);
  std::
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b0);
  std::
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ::~vector(&local_78);
  ReferenceNode::setObject(this->node,this_00);
  Storage::registerObject(this->node->group->storage,this->node->object);
  return this_00;
}

Assistant:

Type& Reference::allocateWithoutLock(Args&&... args) const {
	chatra_assert(node != nullptr);
	Type* object = new Type(node->group.storage, std::forward<Args>(args)...);
	node->setObject(object);
	node->group.storage.registerObject(node->object);
	return *object;
}